

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satProof2.h
# Opt level: O0

void Prf_ManCompact(Prf_Man_t *p,int iNew)

{
  int iVar1;
  int iVar2;
  word *pwVar3;
  int nSize;
  int Entry;
  int k;
  int w;
  int i;
  int iNew_local;
  Prf_Man_t *p_local;
  
  nSize = 0;
  if (p->iFirst < 0) {
    __assert_fail("p->iFirst >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                  ,0xbe,"void Prf_ManCompact(Prf_Man_t *, int)");
  }
  if (p->pInfo != (word *)0x0) {
    __assert_fail("p->pInfo == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                  ,0xbf,"void Prf_ManCompact(Prf_Man_t *, int)");
  }
  iVar1 = Prf_ManSize(p);
  k = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vSaved);
    if (iVar2 <= k) {
      Vec_WrdShrink(p->vInfo,nSize);
      Vec_IntClear(p->vSaved);
      p->pInfo = (word *)0x0;
      if (p->iFirst2 == -1) {
        p->iFirst = iNew;
      }
      else {
        p->iFirst = p->iFirst2;
      }
      p->iFirst2 = -1;
      return;
    }
    iVar2 = Vec_IntEntry(p->vSaved,k);
    if ((iVar2 - p->iFirst < 0) || (iVar1 <= iVar2 - p->iFirst)) break;
    pwVar3 = Prf_ManClauseInfo(p,iVar2 - p->iFirst);
    p->pInfo = pwVar3;
    for (Entry = 0; Entry < p->nWords; Entry = Entry + 1) {
      Vec_WrdWriteEntry(p->vInfo,nSize,p->pInfo[Entry]);
      nSize = nSize + 1;
    }
    k = k + 1;
  }
  __assert_fail("Entry - p->iFirst >= 0 && Entry - p->iFirst < nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                ,0xc3,"void Prf_ManCompact(Prf_Man_t *, int)");
}

Assistant:

static inline void Prf_ManCompact( Prf_Man_t * p, int iNew )
{
    int i, w, k = 0, Entry, nSize;
    assert( p->iFirst >= 0 );
    assert( p->pInfo == NULL );
    nSize = Prf_ManSize( p );
    Vec_IntForEachEntry( p->vSaved, Entry, i )
    {
        assert( Entry - p->iFirst >= 0 && Entry - p->iFirst < nSize );
        p->pInfo = Prf_ManClauseInfo( p, Entry - p->iFirst );
        for ( w = 0; w < p->nWords; w++ )
            Vec_WrdWriteEntry( p->vInfo, k++, p->pInfo[w] );
    }
    Vec_WrdShrink( p->vInfo, k );
    Vec_IntClear( p->vSaved );
    p->pInfo = NULL;
    // update first
    if ( p->iFirst2 == -1 )
        p->iFirst = iNew;
    else
        p->iFirst = p->iFirst2;
    p->iFirst2 = -1;
}